

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall cs::statement_default::run_impl(statement_default *this)

{
  runtime_error *this_00;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Do not allowed standalone default statement.",&local_29);
  runtime_error::runtime_error(this_00,in_stack_ffffffffffffffa8);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void run_impl() override
		{
			throw runtime_error("Do not allowed standalone default statement.");
		}